

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrmatrix.cpp
# Opt level: O0

void __thiscall
TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_>::Initialize
          (TPZDohrMatrix<double,_TPZDohrSubstructCondense<double>_> *this)

{
  bool bVar1;
  TPZFMatrix<double> *local;
  size_type sVar2;
  void *this_00;
  reference pTVar3;
  TPZFMatrix<double> *in_RDI;
  TPZFMatrix<double> diaglocal_1;
  TPZFMatrix<double> diaglocal;
  int isub;
  iterator iter;
  TPZFMatrix<double> diag;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_fffffffffffffdb8;
  list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
  *in_stack_fffffffffffffdc0;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffdd8;
  _Self in_stack_fffffffffffffdf0;
  double *in_stack_fffffffffffffe08;
  int64_t in_stack_fffffffffffffe10;
  int64_t in_stack_fffffffffffffe18;
  TPZFMatrix<double> *in_stack_fffffffffffffe20;
  TPZFMatrix<double> *in_stack_fffffffffffffe28;
  TPZDohrSubstructCondense<double> *in_stack_fffffffffffffe30;
  _Self local_178;
  _List_node_base *local_170;
  _List_node_base *local_168;
  _Self local_c0;
  _List_node_base *local_b8;
  int local_ac;
  _List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> local_a8;
  undefined8 local_a0;
  
  local = (TPZFMatrix<double> *)std::operator<<((ostream *)&std::cout,"Number of substructures ");
  sVar2 = std::__cxx11::
          list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
          ::size(in_stack_fffffffffffffdc0);
  this_00 = (void *)std::ostream::operator<<(local,sVar2);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  sVar2 = std::__cxx11::
          list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
          ::size(in_stack_fffffffffffffdc0);
  tempo.fNumSub = (int)sVar2;
  TPZBaseMatrix::Rows((TPZBaseMatrix *)in_RDI);
  local_a0 = 0;
  TPZFMatrix<double>::TPZFMatrix
            (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
             in_stack_fffffffffffffe08);
  std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::_List_iterator(&local_a8)
  ;
  local_ac = 0;
  local_b8 = (_List_node_base *)
             std::__cxx11::
             list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
             ::begin(in_stack_fffffffffffffdb8);
  local_a8._M_node = local_b8;
  while( true ) {
    local_c0._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
         ::end(in_stack_fffffffffffffdb8);
    bVar1 = std::operator!=(&local_a8,&local_c0);
    if (!bVar1) break;
    TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)in_stack_fffffffffffffdf0._M_node);
    pTVar3 = std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator*
                       ((_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> *)
                        0x1fd6db9);
    in_stack_fffffffffffffdd8 =
         TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(pTVar3);
    TPZDohrSubstructCondense<double>::ContributeDiagonalLocal
              ((TPZDohrSubstructCondense<double> *)in_stack_fffffffffffffdf0._M_node,in_RDI);
    TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
              ((TPZAutoPointer<TPZDohrAssembly<double>_> *)
               &(in_RDI->fPivot).super_TPZVec<int>.fStore);
    TPZDohrAssembly<double>::Assemble
              ((TPZDohrAssembly<double> *)in_stack_fffffffffffffdf0._M_node,
               (int)((ulong)in_RDI >> 0x20),local,(TPZFMatrix<double> *)in_stack_fffffffffffffdd8);
    std::operator<<((ostream *)&std::cout,'*');
    std::ostream::flush();
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fd6e42);
    local_168 = (_List_node_base *)
                std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator++
                          (&local_a8,0);
    local_ac = local_ac + 1;
  }
  std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  local_170 = (_List_node_base *)
              std::__cxx11::
              list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
              ::begin(in_stack_fffffffffffffdb8);
  local_ac = 0;
  local_a8._M_node = local_170;
  while( true ) {
    local_178._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<TPZAutoPointer<TPZDohrSubstructCondense<double>_>,_std::allocator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>_>
         ::end(in_stack_fffffffffffffdb8);
    bVar1 = std::operator!=(&local_a8,&local_178);
    if (!bVar1) break;
    TPZFMatrix<double>::TPZFMatrix((TPZFMatrix<double> *)in_stack_fffffffffffffdf0._M_node);
    TPZAutoPointer<TPZDohrAssembly<double>_>::operator->
              ((TPZAutoPointer<TPZDohrAssembly<double>_> *)
               &(in_RDI->fPivot).super_TPZVec<int>.fStore);
    TPZDohrAssembly<double>::Extract
              ((TPZDohrAssembly<double> *)in_stack_fffffffffffffdf0._M_node,
               (int)((ulong)in_RDI >> 0x20),local,(TPZFMatrix<double> *)in_stack_fffffffffffffdd8);
    pTVar3 = std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator*
                       ((_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_> *)
                        0x1fd6f76);
    TPZAutoPointer<TPZDohrSubstructCondense<double>_>::operator->(pTVar3);
    TPZDohrSubstructCondense<double>::ComputeWeightsLocal
              (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
    TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fd6fa0);
    in_stack_fffffffffffffdf0 =
         std::_List_iterator<TPZAutoPointer<TPZDohrSubstructCondense<double>_>_>::operator++
                   (&local_a8,0);
    local_ac = local_ac + 1;
  }
  TPZFMatrix<double>::~TPZFMatrix((TPZFMatrix<double> *)0x1fd6ff7);
  return;
}

Assistant:

void TPZDohrMatrix<TVar,TSubStruct>::Initialize() 
{
	std::cout << "Number of substructures " << fGlobal.size() << std::endl;
	tempo.fNumSub = fGlobal.size();																// alimenta timeTemp com o numero de substruturas
	TPZFMatrix<TVar> diag(this->Rows(),1,0.);
	typename SubsList::iterator iter;
	int isub = 0;
	for (iter=fGlobal.begin();iter!=fGlobal.end();iter++,isub++) {
        //Basic initialization for each substructure (compute the matrices)
        //(*iter)->Initialize();
		TPZFMatrix<TVar> diaglocal;
        (*iter)->ContributeDiagonalLocal(diaglocal);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
        {
            LOGPZ_DEBUG(logger,"Before assemble diagonal")
        }
#endif
		this->fAssembly->Assemble(isub,diaglocal,diag);
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
			std::stringstream sout;
			sout << "Substructure " << isub << " ";
			diag.Print("Global Diagonal matrix",sout);
			LOGPZ_DEBUG(logger,sout.str())
		}
#endif
        std::cout << '*';
        std::cout.flush();
	}
#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		diag.Print("Global Diagonal matrix",sout);
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif
	std::cout << std::endl;
	for (iter=fGlobal.begin(),isub=0;iter!=fGlobal.end();iter++,isub++) {
        //Computes the Weights for each substructure
		TPZFMatrix<TVar> diaglocal;
		this->fAssembly->Extract(isub,diag,diaglocal);
        (*iter)->ComputeWeightsLocal(diaglocal);
		
	}
}